

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * lua_pushstring(lua_State *L,char *s)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  TString *pTVar4;
  StkId pTVar5;
  char *__assertion;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x215,"const char *lua_pushstring(lua_State *, const char *)");
  }
  if (s != (char *)0x0) {
    pTVar4 = luaS_new(L,s);
    if ((pTVar4->tt & 0xe) < 10) {
      pTVar5 = L->top;
      (pTVar5->value_).gc = (GCObject *)pTVar4;
      bVar1 = pTVar4->tt;
      pTVar5->tt_ = bVar1 | 0x8000;
      if ((-1 < (char)bVar1) && ((pTVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
        pTVar5 = L->top;
        pTVar4 = pTVar4 + 1;
        goto LAB_0011ffa6;
      }
      __assertion = "0";
    }
    else {
      __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x21b,"const char *lua_pushstring(lua_State *, const char *)");
  }
  pTVar5 = L->top;
  pTVar4 = (TString *)0x0;
  pTVar5->tt_ = 0;
LAB_0011ffa6:
  L->top = pTVar5 + 1;
  if (L->ci->top < pTVar5 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x21e,"const char *lua_pushstring(lua_State *, const char *)");
  }
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  piVar3 = *(int **)&L[-1].hookmask;
  *piVar3 = *piVar3 + -1;
  if (*piVar3 == 0) {
    return (char *)pTVar4;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x220,"const char *lua_pushstring(lua_State *, const char *)");
}

Assistant:

LUA_API const char *lua_pushstring (lua_State *L, const char *s) {
  lua_lock(L);
  if (s == NULL)
    setnilvalue(L->top);
  else {
    TString *ts;
    ts = luaS_new(L, s);
    setsvalue2s(L, L->top, ts);
    s = getstr(ts);  /* internal copy's address */
  }
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return s;
}